

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

void __thiscall QDialogPrivate::~QDialogPrivate(QDialogPrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QDialogPrivate_00800ec0;
  if (this->m_platformHelper != (QPlatformDialogHelper *)0x0) {
    (**(code **)(*(long *)this->m_platformHelper + 0x20))();
  }
  pDVar1 = (this->eventLoop).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      pDVar1 = (this->eventLoop).wp.d;
      if (pDVar1 == (Data *)0x0) {
        pDVar1 = (Data *)0x0;
      }
      operator_delete(pDVar1);
    }
  }
  pDVar1 = (this->mainDef).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      pDVar1 = (this->mainDef).wp.d;
      if (pDVar1 == (Data *)0x0) {
        pDVar1 = (Data *)0x0;
      }
      operator_delete(pDVar1);
    }
  }
  QWidgetPrivate::~QWidgetPrivate(&this->super_QWidgetPrivate);
  return;
}

Assistant:

QDialogPrivate::~QDialogPrivate()
{
    delete m_platformHelper;
}